

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O2

int b_replace(lua_State *L)

{
  uint uVar1;
  lua_Integer lVar2;
  lua_Integer lVar3;
  ulong uVar4;
  int w;
  
  lVar2 = luaL_checkinteger(L,1);
  lVar3 = luaL_checkinteger(L,2);
  uVar1 = fieldargs(L,3,&w);
  uVar4 = ~(0x1fffffffe << ((ulong)(byte)((char)w - 1) & 0x3f));
  lua_pushinteger(L,(ulong)((uint)uVar4 & (uint)lVar3) << ((ulong)uVar1 & 0x3f) |
                    (ulong)(~(uint)(uVar4 << ((ulong)uVar1 & 0x3f)) & (uint)lVar2));
  return 1;
}

Assistant:

static int b_replace (lua_State *L) {
  int w;
  lua_Unsigned r = trim(checkunsigned(L, 1));
  lua_Unsigned v = trim(checkunsigned(L, 2));
  int f = fieldargs(L, 3, &w);
  lua_Unsigned m = mask(w);
  r = (r & ~(m << f)) | ((v & m) << f);
  pushunsigned(L, r);
  return 1;
}